

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

undefined8 utilities::trim(string *s)

{
  undefined8 in_RDI;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  
  ltrim(in_stack_ffffffffffffffd8);
  rtrim(in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string trim(const std::string& s)
    {
        return rtrim(ltrim(s));
    }